

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomModel.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::CustomModel::InternalSwap(CustomModel *this,CustomModel *other)

{
  int iVar1;
  string *psVar2;
  
  google::protobuf::
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>
  ::swap(&(this->parameters_).map_,&(other->parameters_).map_);
  psVar2 = (this->classname_).ptr_;
  (this->classname_).ptr_ = (other->classname_).ptr_;
  (other->classname_).ptr_ = psVar2;
  psVar2 = (this->description_).ptr_;
  (this->description_).ptr_ = (other->description_).ptr_;
  (other->description_).ptr_ = psVar2;
  iVar1 = this->_cached_size_;
  this->_cached_size_ = other->_cached_size_;
  other->_cached_size_ = iVar1;
  return;
}

Assistant:

void CustomModel::InternalSwap(CustomModel* other) {
  parameters_.Swap(&other->parameters_);
  classname_.Swap(&other->classname_);
  description_.Swap(&other->description_);
  std::swap(_cached_size_, other->_cached_size_);
}